

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_twin_messenger.c
# Opt level: O2

int twin_messenger_get_send_status
              (TWIN_MESSENGER_HANDLE twin_msgr_handle,TWIN_MESSENGER_SEND_STATUS *send_status)

{
  LOGGER_LOG p_Var1;
  LIST_ITEM_HANDLE pLVar2;
  TWIN_MESSENGER_SEND_STATUS TVar3;
  int iVar4;
  TWIN_MESSENGER_INSTANCE_conflict *twin_msgr;
  TWIN_OPERATION_TYPE twin_op_type;
  
  if (twin_msgr_handle == (TWIN_MESSENGER_HANDLE)0x0 ||
      send_status == (TWIN_MESSENGER_SEND_STATUS *)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar4 = 0x78a;
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_twin_messenger.c"
                ,"twin_messenger_get_send_status",0x789,1,
                "Invalid argument (twin_msgr_handle=%p, send_status=%p)",twin_msgr_handle,
                send_status);
    }
  }
  else {
    twin_op_type = TWIN_OPERATION_TYPE_PATCH;
    pLVar2 = singlylinkedlist_get_head_item(twin_msgr_handle->pending_patches);
    if (pLVar2 == (LIST_ITEM_HANDLE)0x0) {
      pLVar2 = singlylinkedlist_find
                         (twin_msgr_handle->operations,find_twin_operation_by_type,&twin_op_type);
      TVar3 = (TWIN_MESSENGER_SEND_STATUS)(pLVar2 != (LIST_ITEM_HANDLE)0x0);
    }
    else {
      TVar3 = TWIN_MESSENGER_SEND_STATUS_BUSY;
    }
    *send_status = TVar3;
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int twin_messenger_get_send_status(TWIN_MESSENGER_HANDLE twin_msgr_handle, TWIN_MESSENGER_SEND_STATUS* send_status)
{
    int result;

    if (twin_msgr_handle == NULL || send_status == NULL)
    {
        LogError("Invalid argument (twin_msgr_handle=%p, send_status=%p)", twin_msgr_handle, send_status);
        result = MU_FAILURE;
    }
    else
    {
        TWIN_MESSENGER_INSTANCE* twin_msgr = (TWIN_MESSENGER_INSTANCE*)twin_msgr_handle;
        TWIN_OPERATION_TYPE twin_op_type = TWIN_OPERATION_TYPE_PATCH;

        if (singlylinkedlist_get_head_item(twin_msgr->pending_patches) != NULL ||
            singlylinkedlist_find(twin_msgr->operations, find_twin_operation_by_type, &twin_op_type))
        {
            *send_status = TWIN_MESSENGER_SEND_STATUS_BUSY;
        }
        else
        {
            *send_status = TWIN_MESSENGER_SEND_STATUS_IDLE;
        }

        result = RESULT_OK;
    }

    return result;
}